

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-util.cc
# Opt level: O2

void wabt::interp::WriteValues(Stream *stream,ValueTypes *types,Values *values)

{
  u64 *puVar1;
  pointer pVVar2;
  pointer pVVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  TypedValue local_48;
  
  pVVar2 = (values->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (values->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 == (long)pVVar3 - (long)pVVar2 >> 4) {
    lVar5 = 0;
    for (uVar4 = 0; uVar4 < (ulong)((long)pVVar3 - (long)pVVar2 >> 4); uVar4 = uVar4 + 1) {
      local_48.type =
           (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar4];
      puVar1 = (u64 *)((long)&pVVar2->field_0 + lVar5);
      local_48.value.field_0.i64_ = *puVar1;
      local_48.value.field_0._8_8_ = puVar1[1];
      WriteValue(stream,&local_48);
      pVVar2 = (values->
               super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pVVar3 = (values->
               super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (uVar4 != ((long)pVVar3 - (long)pVVar2 >> 4) - 1U) {
        Stream::Writef(stream,", ");
        pVVar2 = (values->
                 super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar3 = (values->
                 super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      lVar5 = lVar5 + 0x10;
    }
    return;
  }
  __assert_fail("types.size() == values.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp-util.cc"
                ,0x51,"void wabt::interp::WriteValues(Stream *, const ValueTypes &, const Values &)"
               );
}

Assistant:

void WriteValues(Stream* stream,
                 const ValueTypes& types,
                 const Values& values) {
  assert(types.size() == values.size());
  for (size_t i = 0; i < values.size(); ++i) {
    WriteValue(stream, TypedValue{types[i], values[i]});
    if (i != values.size() - 1) {
      stream->Writef(", ");
    }
  }
}